

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolb.c
# Opt level: O0

int ffg3db(fitsfile *fptr,long group,uchar nulval,LONGLONG ncols,LONGLONG nrows,LONGLONG naxis1,
          LONGLONG naxis2,LONGLONG naxis3,uchar *array,int *anynul,int *status)

{
  int iVar1;
  long in_RCX;
  long in_R8;
  long in_R9;
  long in_stack_00000008;
  long in_stack_00000010;
  int *in_stack_00000028;
  uchar nullvalue;
  LONGLONG lpixel [3];
  LONGLONG fpixel [3];
  long inc [3];
  int nullcheck;
  char cdummy;
  LONGLONG nfits;
  LONGLONG narray;
  long jj;
  long ii;
  long tablerow;
  int in_stack_00000234;
  long *in_stack_00000238;
  LONGLONG *in_stack_00000240;
  LONGLONG *in_stack_00000248;
  int in_stack_00000254;
  fitsfile *in_stack_00000258;
  void *in_stack_00000290;
  void *in_stack_00000298;
  char *in_stack_000002a0;
  int *in_stack_000002a8;
  int *in_stack_000002b0;
  long in_stack_000071b0;
  LONGLONG in_stack_000071b8;
  LONGLONG in_stack_000071c0;
  LONGLONG in_stack_000071c8;
  int in_stack_000071d4;
  fitsfile *in_stack_000071d8;
  int in_stack_00007220;
  uchar in_stack_00007228;
  uchar *in_stack_00007230;
  char *in_stack_00007238;
  int *in_stack_00007240;
  int *in_stack_00007248;
  fitsfile *in_stack_fffffffffffffee8;
  long local_68;
  long local_60;
  int local_1c;
  
  iVar1 = fits_is_compressed_image(in_stack_fffffffffffffee8,(int *)0x182915);
  if (iVar1 == 0) {
    if ((in_RCX == in_R9) && (in_R8 == in_stack_00000008)) {
      ffgclb(in_stack_000071d8,in_stack_000071d4,in_stack_000071c8,in_stack_000071c0,
             in_stack_000071b8,in_stack_000071b0,in_stack_00007220,in_stack_00007228,
             in_stack_00007230,in_stack_00007238,in_stack_00007240,in_stack_00007248);
      local_1c = *in_stack_00000028;
    }
    else if ((in_RCX < in_R9) || (in_R8 < in_stack_00000008)) {
      *in_stack_00000028 = 0x140;
      local_1c = 0x140;
    }
    else {
      for (local_68 = 0; local_68 < in_stack_00000010; local_68 = local_68 + 1) {
        for (local_60 = 0; local_60 < in_stack_00000008; local_60 = local_60 + 1) {
          iVar1 = ffgclb(in_stack_000071d8,in_stack_000071d4,in_stack_000071c8,in_stack_000071c0,
                         in_stack_000071b8,in_stack_000071b0,in_stack_00007220,in_stack_00007228,
                         in_stack_00007230,in_stack_00007238,in_stack_00007240,in_stack_00007248);
          if (0 < iVar1) {
            return *in_stack_00000028;
          }
        }
      }
      local_1c = *in_stack_00000028;
    }
  }
  else {
    fits_read_compressed_img
              (in_stack_00000258,in_stack_00000254,in_stack_00000248,in_stack_00000240,
               in_stack_00000238,in_stack_00000234,in_stack_00000290,in_stack_00000298,
               in_stack_000002a0,in_stack_000002a8,in_stack_000002b0);
    local_1c = *in_stack_00000028;
  }
  return local_1c;
}

Assistant:

int ffg3db(fitsfile *fptr,  /* I - FITS file pointer                       */
           long  group,     /* I - group to read (1 = 1st group)           */
           unsigned char nulval, /* set undefined pixels equal to this     */
           LONGLONG  ncols,     /* I - number of pixels in each row of array   */
           LONGLONG  nrows,     /* I - number of rows in each plane of array   */
           LONGLONG  naxis1,    /* I - FITS image NAXIS1 value                 */
           LONGLONG  naxis2,    /* I - FITS image NAXIS2 value                 */
           LONGLONG  naxis3,    /* I - FITS image NAXIS3 value                 */
           unsigned char *array, /* O - array to be filled and returned    */
           int  *anynul,    /* O - set to 1 if any values are null; else 0 */
           int  *status)    /* IO - error status                           */
/*
  Read an entire 3-D array of values to the primary array. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of the
  FITS array is not the same as the array being read).  Any null
  values in the array will be set equal to the value of nulval, unless
  nulval = 0 in which case no null checking will be performed.
*/
{
    long tablerow, ii, jj;
    LONGLONG narray, nfits;
    char cdummy;
    int  nullcheck = 1;
    long inc[] = {1,1,1};
    LONGLONG fpixel[] = {1,1,1};
    LONGLONG lpixel[3];
    unsigned char nullvalue;

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        lpixel[0] = ncols;
        lpixel[1] = nrows;
        lpixel[2] = naxis3;
        nullvalue = nulval;  /* set local variable */

        fits_read_compressed_img(fptr, TBYTE, fpixel, lpixel, inc,
            nullcheck, &nullvalue, array, NULL, anynul, status);
        return(*status);
    }

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */
    tablerow=maxvalue(1,group);

    if (ncols == naxis1 && nrows == naxis2)  /* arrays have same size? */
    {
       /* all the image pixels are contiguous, so read all at once */
       ffgclb(fptr, 2, tablerow, 1, naxis1 * naxis2 * naxis3, 1, 1, nulval,
               array, &cdummy, anynul, status);
       return(*status);
    }

    if (ncols < naxis1 || nrows < naxis2)
       return(*status = BAD_DIMEN);

    nfits = 1;   /* next pixel in FITS image to read */
    narray = 0;  /* next pixel in output array to be filled */

    /* loop over naxis3 planes in the data cube */
    for (jj = 0; jj < naxis3; jj++)
    {
      /* loop over the naxis2 rows in the FITS image, */
      /* reading naxis1 pixels to each row            */

      for (ii = 0; ii < naxis2; ii++)
      {
       if (ffgclb(fptr, 2, tablerow, nfits, naxis1, 1, 1, nulval,
          &array[narray], &cdummy, anynul, status) > 0)
          return(*status);

       nfits += naxis1;
       narray += ncols;
      }
      narray += (nrows - naxis2) * ncols;
    }

    return(*status);
}